

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_int32 ma_pcm_rb_pointer_distance(ma_pcm_rb *pRB)

{
  uint uVar1;
  
  if (pRB != (ma_pcm_rb *)0x0) {
    uVar1 = ma_rb_pointer_distance(&pRB->rb);
    return uVar1 / (*(int *)(&DAT_001908a0 + (ulong)pRB->format * 4) * pRB->channels);
  }
  return 0;
}

Assistant:

MA_API ma_int32 ma_pcm_rb_pointer_distance(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return 0;
    }

    return ma_rb_pointer_distance(&pRB->rb) / ma_pcm_rb_get_bpf(pRB);
}